

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,UntypedMapBase *map,uint32_t tag,
               NodeBase *node,MapAuxInfo map_info)

{
  bool bVar1;
  bool *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  uint *puVar3;
  unsigned_long *puVar4;
  int *piVar5;
  UnknownFieldOps *pUVar6;
  char *file;
  int line;
  string_view sVar7;
  MapTypeCard local_d0;
  MessageLite *local_c0;
  TcParseTableBase *local_b8;
  string serialized;
  CodedOutputStream coded_output;
  StringOutputStream string_output;
  
  serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
  serialized._M_string_length = 0;
  serialized.field_2._M_local_buf[0] = '\0';
  io::StringOutputStream::StringOutputStream(&string_output,&serialized);
  local_c0 = msg;
  local_b8 = table;
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            (&coded_output,&string_output);
  local_d0 = map_info.key_type_card;
  line = 0xa74;
  switch(map_info._0_4_ & 7) {
  case 0:
    line = 0x1f0;
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
    ;
    switch((map->type_info_).field_0x3 & 0xf) {
    case 0:
      pbVar2 = UntypedMapBase::GetKey<bool>(map,node);
      WireFormatLite::WriteBool(1,*pbVar2,&coded_output);
      break;
    case 1:
      puVar3 = UntypedMapBase::GetKey<unsigned_int>(map,node);
      bVar1 = MapTypeCard::is_zigzag(&local_d0);
      if (bVar1) {
        WireFormatLite::WriteSInt32(1,*puVar3,&coded_output);
      }
      else if (((ushort)local_d0 & 0x100) == 0) {
        WireFormatLite::WriteUInt32(1,*puVar3,&coded_output);
      }
      else {
        WireFormatLite::WriteInt32(1,*puVar3,&coded_output);
      }
      break;
    case 2:
      puVar4 = UntypedMapBase::GetKey<unsigned_long>(map,node);
      bVar1 = MapTypeCard::is_zigzag(&local_d0);
      if (bVar1) {
        WireFormatLite::WriteSInt64(1,*puVar4,&coded_output);
      }
      else if (((ushort)local_d0 & 0x100) == 0) {
        WireFormatLite::WriteUInt64(1,*puVar4,&coded_output);
      }
      else {
        WireFormatLite::WriteInt64(1,*puVar4,&coded_output);
      }
      break;
    case 5:
      line = 0xa63;
      UntypedMapBase::GetKey<std::__cxx11::string>(map,node);
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
    default:
switchD_001cd4b5_caseD_3:
      Unreachable(file,line);
    }
    break;
  case 1:
    puVar4 = UntypedMapBase::GetKey<unsigned_long>(map,node);
    WireFormatLite::WriteFixed64(1,*puVar4,&coded_output);
    break;
  case 2:
    value = UntypedMapBase::GetKey<std::__cxx11::string>(map,node);
    WireFormatLite::WriteString(1,value,&coded_output);
    break;
  default:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    goto switchD_001cd4b5_caseD_3;
  case 5:
    puVar3 = UntypedMapBase::GetKey<unsigned_int>(map,node);
    WireFormatLite::WriteFixed32(1,*puVar3,&coded_output);
  }
  if (((uint5)map_info & 0x1000000000) != 0) {
    piVar5 = UntypedMapBase::GetValue<int>(map,node);
    WireFormatLite::WriteInt32(2,*piVar5,&coded_output);
    io::CodedOutputStream::~CodedOutputStream(&coded_output);
    pUVar6 = GetUnknownFieldOps(local_b8);
    sVar7._M_str = serialized._M_dataplus._M_p;
    sVar7._M_len = serialized._M_string_length;
    (*pUVar6->write_length_delimited)(local_c0,tag >> 3,sVar7);
    if (map->arena_ == (Arena *)0x0) {
      UntypedMapBase::DeleteNode(map,node);
    }
    std::__cxx11::string::~string((string *)&serialized);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0xa82,"map_info.value_is_validated_enum");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d0);
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      UntypedMapBase& map, uint32_t tag,
                                      NodeBase* node, MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(map, node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2, *map.GetValue<int32_t>(node), &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);

  if (map.arena() == nullptr) {
    map.DeleteNode(node);
  }
}